

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ReadFileResult
cmCMakePresetsGraphInternal::PresetVectorIntHelper
          (vector<int,_std::allocator<int>_> *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  
  if (PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)::helper ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      VectorFilter<int,cmCMakePresetsGraph::ReadFileResult(*)(int&,Json::Value_const*),cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Vector<int,cmCMakePresetsGraph::ReadFileResult(*)(int&,Json::Value_const*)>(cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult(*)(int&,Json::Value_const*))::_lambda(int_const&)_1_>
                (&PresetVectorIntHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,10,PresetIntHelper)
      ;
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetVectorIntHelper::helper,&__dso_handle
                  );
      __cxa_guard_release(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)
                           ::helper);
    }
  }
  RVar1 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<int,_std::allocator<int>_>_&,_const_Json::Value_*)>
          ::operator()(&PresetVectorIntHelper::helper,out,value);
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetVectorIntHelper(
  std::vector<int>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<int>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET, PresetIntHelper);

  return helper(out, value);
}